

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_address.cpp
# Opt level: O0

void __thiscall
cfdcapi_elements_address_ConfidentialAddress_Test::TestBody
          (cfdcapi_elements_address_ConfidentialAddress_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  char *str_buffer;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  int net_type;
  char *key;
  char *addr;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char *confidential_address;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  int *in_stack_00000338;
  char **in_stack_00000340;
  char **in_stack_00000348;
  char *in_stack_00000350;
  void *in_stack_00000358;
  char **in_stack_000003d0;
  char *in_stack_000003d8;
  char *in_stack_000003e0;
  void *in_stack_000003e8;
  bool *in_stack_fffffffffffffcf8;
  AssertionResult *in_stack_fffffffffffffd00;
  CfdErrorCode *in_stack_fffffffffffffd08;
  AssertionResult *pAVar3;
  undefined7 in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd17;
  void **in_stack_fffffffffffffd18;
  void *in_stack_fffffffffffffd38;
  char **in_stack_fffffffffffffd90;
  AssertionResult *in_stack_fffffffffffffd98;
  AssertHelper local_200;
  Message local_1f8;
  undefined4 local_1ec;
  AssertionResult local_1e8;
  AssertHelper local_1d8;
  Message local_1d0;
  AssertionResult local_1c8;
  AssertHelper local_1b8;
  Message local_1b0;
  undefined4 local_1a4;
  AssertionResult local_1a0;
  char *local_190;
  AssertHelper local_188;
  Message local_180;
  AssertionResult local_178;
  AssertHelper local_168;
  Message local_160;
  AssertionResult local_158;
  AssertHelper local_148;
  Message local_140;
  AssertionResult local_138;
  AssertHelper local_128;
  Message local_120;
  undefined4 local_114;
  AssertionResult local_110;
  undefined4 local_fc;
  char *local_f8;
  char *local_f0;
  AssertHelper local_e8;
  Message local_e0;
  AssertionResult local_d8;
  AssertHelper local_c8;
  Message local_c0;
  undefined4 local_b4;
  AssertionResult local_b0;
  char *local_a0;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle(in_stack_fffffffffffffd18);
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffd18,
             (char *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
             in_stack_fffffffffffffd08,(int *)in_stack_fffffffffffffd00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x32d8aa);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_address.cpp"
               ,0x1a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x32d90d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x32d962);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,(type *)0x32d996);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_address.cpp"
               ,0x1b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x32da92);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x32db0d);
  local_a0 = (char *)0x0;
  local_14 = CfdCreateConfidentialAddress
                       (in_stack_000003e8,in_stack_000003e0,in_stack_000003d8,in_stack_000003d0);
  local_b4 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffd18,
             (char *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
             in_stack_fffffffffffffd08,(int *)in_stack_fffffffffffffd00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x32dbf0);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_address.cpp"
               ,0x25,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message((Message *)0x32dc53);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x32dca8);
  if (local_14 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_d8,"kConfidentialAddr","confidential_address",
               TestBody::kConfidentialAddr,local_a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d8);
    if (!bVar1) {
      testing::Message::Message(&local_e0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x32dd57);
      testing::internal::AssertHelper::AssertHelper
                (&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_address.cpp"
                 ,0x27,pcVar2);
      testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
      testing::internal::AssertHelper::~AssertHelper(&local_e8);
      testing::Message::~Message((Message *)0x32ddba);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x32de12);
    local_f0 = (char *)0x0;
    local_f8 = (char *)0x0;
    local_fc = 0;
    local_14 = CfdParseConfidentialAddress
                         (in_stack_00000358,in_stack_00000350,in_stack_00000348,in_stack_00000340,
                          in_stack_00000338);
    local_114 = 0;
    in_stack_fffffffffffffd98 = &local_110;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffd18,
               (char *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
               in_stack_fffffffffffffd08,(int *)in_stack_fffffffffffffd00);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffd98);
    if (!bVar1) {
      testing::Message::Message(&local_120);
      in_stack_fffffffffffffd90 =
           (char **)testing::AssertionResult::failure_message((AssertionResult *)0x32df16);
      testing::internal::AssertHelper::AssertHelper
                (&local_128,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_address.cpp"
                 ,0x2e,(char *)in_stack_fffffffffffffd90);
      testing::internal::AssertHelper::operator=(&local_128,&local_120);
      testing::internal::AssertHelper::~AssertHelper(&local_128);
      testing::Message::~Message((Message *)0x32df79);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x32dfce);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_138,"kAddress","addr",TestBody::kAddress,local_f0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_138);
      if (!bVar1) {
        testing::Message::Message(&local_140);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x32e07d);
        testing::internal::AssertHelper::AssertHelper
                  (&local_148,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_address.cpp"
                   ,0x30,pcVar2);
        testing::internal::AssertHelper::operator=(&local_148,&local_140);
        testing::internal::AssertHelper::~AssertHelper(&local_148);
        testing::Message::~Message((Message *)0x32e0e0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x32e135);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_158,"kConfidentialKey","key",TestBody::kConfidentialKey,local_f8
                );
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_158);
      if (!bVar1) {
        testing::Message::Message(&local_160);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x32e1ca);
        testing::internal::AssertHelper::AssertHelper
                  (&local_168,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_address.cpp"
                   ,0x31,pcVar2);
        testing::internal::AssertHelper::operator=(&local_168,&local_160);
        testing::internal::AssertHelper::~AssertHelper(&local_168);
        testing::Message::~Message((Message *)0x32e227);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x32e27c);
      testing::internal::EqHelper<false>::Compare<int,int>
                ((char *)in_stack_fffffffffffffd18,
                 (char *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                 in_stack_fffffffffffffd08,(int *)in_stack_fffffffffffffd00);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_178);
      if (!bVar1) {
        testing::Message::Message(&local_180);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x32e311);
        testing::internal::AssertHelper::AssertHelper
                  (&local_188,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_address.cpp"
                   ,0x32,pcVar2);
        testing::internal::AssertHelper::operator=(&local_188,&local_180);
        testing::internal::AssertHelper::~AssertHelper(&local_188);
        testing::Message::~Message((Message *)0x32e36e);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x32e3c3);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffd08);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffd08);
    }
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffd08);
  }
  local_14 = CfdGetLastErrorCode(in_stack_fffffffffffffd38);
  if (local_14 != 0) {
    local_190 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    local_1a4 = 0;
    pAVar3 = &local_1a0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffd18,
               (char *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
               in_stack_fffffffffffffd08,(int *)in_stack_fffffffffffffd00);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
    if (!bVar1) {
      testing::Message::Message(&local_1b0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x32e4d7);
      testing::internal::AssertHelper::AssertHelper
                (&local_1b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_address.cpp"
                 ,0x3e,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
      testing::internal::AssertHelper::~AssertHelper(&local_1b8);
      testing::Message::~Message((Message *)0x32e534);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x32e589);
    testing::internal::CmpHelperSTREQ((internal *)&local_1c8,"\"\"","str_buffer","",local_190);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c8);
    if (!bVar1) {
      testing::Message::Message(&local_1d0);
      in_stack_fffffffffffffd18 =
           (void **)testing::AssertionResult::failure_message((AssertionResult *)0x32e61e);
      testing::internal::AssertHelper::AssertHelper
                (&local_1d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_address.cpp"
                 ,0x3f,(char *)in_stack_fffffffffffffd18);
      testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
      testing::internal::AssertHelper::~AssertHelper(&local_1d8);
      testing::Message::~Message((Message *)0x32e67b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x32e6d0);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffd08);
    local_190 = (char *)0x0;
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffffd08);
  local_1ec = 0;
  pAVar3 = &local_1e8;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffd18,
             (char *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
             (CfdErrorCode *)pAVar3,(int *)in_stack_fffffffffffffd00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x32e7a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_address.cpp"
               ,0x45,pcVar2);
    testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    testing::Message::~Message((Message *)0x32e7fd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x32e852);
  return;
}

Assistant:

TEST(cfdcapi_elements_address, ConfidentialAddress) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  static const char* kAddress = "Q7wegLt2qMGhm28vch6VTzvpzs8KXvs4X7";
  static const char* kConfidentialKey = "025476c2e83188368da1ff3e292e7acafcdb3566bb0ad253f62fc70f07aeee6357";
  static const char* kConfidentialAddr = "VTpvKKc1SNmLG4H8CnR1fGJdHdyWGEQEvdP9gfeneJR7n81S5kiwNtgF7vrZjC8mp63HvwxM81nEbTxU";
  static int kNetworkType = kCfdNetworkLiquidv1;

  char* confidential_address = nullptr;
  ret = CfdCreateConfidentialAddress(
      handle, kAddress, kConfidentialKey, &confidential_address);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ(kConfidentialAddr, confidential_address);

    char* addr = nullptr;
    char* key = nullptr;
    int net_type = kCfdNetworkMainnet;
    ret = CfdParseConfidentialAddress(
        handle, confidential_address, &addr, &key, &net_type);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(kAddress, addr);
      EXPECT_STREQ(kConfidentialKey, key);
      EXPECT_EQ(kNetworkType, net_type);
      CfdFreeStringBuffer(addr);
      CfdFreeStringBuffer(key);
    }

    CfdFreeStringBuffer(confidential_address);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}